

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O0

Mpm_Cut_t * Mpm_ManMergeCuts(Mpm_Man_t *p,Mpm_Cut_t *pCut0,Mpm_Cut_t *pCut1,Mpm_Cut_t *pCut2)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Mpm_Cut_t *pNew;
  uint uVar4;
  Mpm_Cut_t *local_68;
  Mpm_Cut_t *local_58;
  int local_48;
  int iPlace;
  int c;
  int i;
  Mpm_Cut_t *pCut;
  Mpm_Cut_t *pTemp;
  Mpm_Cut_t *pCut2_local;
  Mpm_Cut_t *pCut1_local;
  Mpm_Cut_t *pCut0_local;
  Mpm_Man_t *p_local;
  
  pvVar3 = Vec_PtrEntryLast(&p->vFreeUnits);
  pNew = (Mpm_Cut_t *)((long)pvVar3 + 0x1c);
  memcpy((void *)((long)pvVar3 + 0x24),pCut0->pLeaves,
         (ulong)(*(uint *)&pCut0->field_0x4 >> 0x1b) << 2);
  *(uint *)((long)pvVar3 + 0x20) =
       *(uint *)((long)pvVar3 + 0x20) & 0x7ffffff | *(uint *)&pCut0->field_0x4 & 0xf8000000;
  if (p->pPars->fUseDsd == 0) {
    for (local_48 = 1; local_48 < 3; local_48 = local_48 + 1) {
      local_68 = pCut2;
      if (local_48 == 1) {
        local_68 = pCut1;
      }
      if (local_68 == (Mpm_Cut_t *)0x0) break;
      for (iPlace = 0; iPlace < (int)(*(uint *)&local_68->field_0x4 >> 0x1b); iPlace = iPlace + 1) {
        iVar1 = Abc_Lit2Var(local_68->pLeaves[iPlace]);
        uVar2 = Mpm_CutFindLeaf(pNew,iVar1);
        if (uVar2 == *(uint *)((long)pvVar3 + 0x20) >> 0x1b) {
          if (*(uint *)((long)pvVar3 + 0x20) >> 0x1b == p->nLutSize) {
            return (Mpm_Cut_t *)0x0;
          }
          iVar1 = local_68->pLeaves[iPlace];
          uVar2 = *(uint *)((long)pvVar3 + 0x20) >> 0x1b;
          *(uint *)((long)pvVar3 + 0x20) =
               *(uint *)((long)pvVar3 + 0x20) & 0x7ffffff | (uVar2 + 1) * 0x8000000;
          *(int *)((long)pvVar3 + (ulong)uVar2 * 4 + 0x24) = iVar1;
        }
      }
    }
  }
  else {
    for (local_48 = 1; local_48 < 3; local_48 = local_48 + 1) {
      local_58 = pCut2;
      if (local_48 == 1) {
        local_58 = pCut1;
      }
      if (local_58 == (Mpm_Cut_t *)0x0) break;
      p->uPermMask[local_48] = 0x3ffff;
      p->uComplMask[local_48] = 0;
      for (iPlace = 0; iPlace < (int)(*(uint *)&local_58->field_0x4 >> 0x1b); iPlace = iPlace + 1) {
        iVar1 = Abc_Lit2Var(local_58->pLeaves[iPlace]);
        uVar2 = Mpm_CutFindLeaf(pNew,iVar1);
        if (uVar2 == *(uint *)((long)pvVar3 + 0x20) >> 0x1b) {
          if (*(uint *)((long)pvVar3 + 0x20) >> 0x1b == p->nLutSize) {
            return (Mpm_Cut_t *)0x0;
          }
          iVar1 = local_58->pLeaves[iPlace];
          uVar4 = *(uint *)((long)pvVar3 + 0x20) >> 0x1b;
          *(uint *)((long)pvVar3 + 0x20) =
               *(uint *)((long)pvVar3 + 0x20) & 0x7ffffff | (uVar4 + 1) * 0x8000000;
          *(int *)((long)pvVar3 + (ulong)uVar4 * 4 + 0x24) = iVar1;
        }
        p->uPermMask[local_48] =
             (iPlace & 7U ^ 7) << ((byte)uVar2 * '\x03' & 0x1f) ^ p->uPermMask[local_48];
        if (local_58->pLeaves[iPlace] != *(int *)((long)pvVar3 + (long)(int)uVar2 * 4 + 0x24)) {
          p->uComplMask[local_48] = 1 << ((byte)uVar2 & 0x1f) | p->uComplMask[local_48];
        }
      }
    }
  }
  if (pCut1 == (Mpm_Cut_t *)0x0) {
    pNew->hNext = 0;
    *(uint *)((long)pvVar3 + 0x20) =
         *(uint *)((long)pvVar3 + 0x20) & 0xfe000000 | *(uint *)&pCut0->field_0x4 & 0x1ffffff;
    *(uint *)((long)pvVar3 + 0x20) =
         *(uint *)((long)pvVar3 + 0x20) & 0xfbffffff |
         (*(uint *)&pCut0->field_0x4 >> 0x1a & 1) << 0x1a;
    *(uint *)((long)pvVar3 + 0x20) =
         *(uint *)((long)pvVar3 + 0x20) & 0xfdffffff |
         (*(uint *)&pCut0->field_0x4 >> 0x19 & 1) << 0x19;
  }
  else {
    pNew->hNext = 0;
    *(uint *)((long)pvVar3 + 0x20) = *(uint *)((long)pvVar3 + 0x20) & 0xfe000000;
    *(uint *)((long)pvVar3 + 0x20) =
         *(uint *)((long)pvVar3 + 0x20) & 0xfe000000 |
         (*(uint *)((long)pvVar3 + 0x20) & 0x1ffffff ^ 0xffffffff) & 0x1ffffff;
    *(uint *)((long)pvVar3 + 0x20) = *(uint *)((long)pvVar3 + 0x20) & 0xfbffffff;
    *(uint *)((long)pvVar3 + 0x20) = *(uint *)((long)pvVar3 + 0x20) & 0xfdffffff;
  }
  p->nCutsMerged = p->nCutsMerged + 1;
  p->nCutsMergedAll = p->nCutsMergedAll + 1;
  if (p->pPars->fUseTruth != 0) {
    Vec_IntSelectSort((int *)((long)pvVar3 + 0x24),*(uint *)((long)pvVar3 + 0x20) >> 0x1b);
  }
  return pNew;
}

Assistant:

static inline Mpm_Cut_t * Mpm_ManMergeCuts( Mpm_Man_t * p, Mpm_Cut_t * pCut0, Mpm_Cut_t * pCut1, Mpm_Cut_t * pCut2 )
{
    Mpm_Cut_t * pTemp, * pCut = &((Mpm_Uni_t *)Vec_PtrEntryLast(&p->vFreeUnits))->pCut;
    int i, c, iPlace;
    // base cut
    memcpy( pCut->pLeaves, pCut0->pLeaves, sizeof(int) * pCut0->nLeaves );
    pCut->nLeaves = pCut0->nLeaves;
    // remaining cuts
    if ( p->pPars->fUseDsd )
    {
        for ( c = 1; c < 3; c++ )
        {
            pTemp = (c == 1) ? pCut1 : pCut2;
            if ( pTemp == NULL )
                break;
            p->uPermMask[c] = 0x3FFFF; // 18 bits
            p->uComplMask[c] = 0;     
            for ( i = 0; i < (int)pTemp->nLeaves; i++ )
            {
                iPlace = Mpm_CutFindLeaf( pCut, Abc_Lit2Var(pTemp->pLeaves[i]) );
                if ( iPlace == (int)pCut->nLeaves )
                {
                    if ( (int)pCut->nLeaves == p->nLutSize )
                        return NULL;
                    pCut->pLeaves[pCut->nLeaves++] = pTemp->pLeaves[i];
                }
                p->uPermMask[c] ^= (((i & 7) ^ 7) << (3*iPlace));
                if ( pTemp->pLeaves[i] != pCut->pLeaves[iPlace] )
                    p->uComplMask[c] |= (1 << iPlace);
            }
        }
    }
    else
    {
        for ( c = 1; c < 3; c++ )
        {
            pTemp = (c == 1) ? pCut1 : pCut2;
            if ( pTemp == NULL )
                break;
            for ( i = 0; i < (int)pTemp->nLeaves; i++ )
            {
                iPlace = Mpm_CutFindLeaf( pCut, Abc_Lit2Var(pTemp->pLeaves[i]) );
                if ( iPlace == (int)pCut->nLeaves )
                {
                    if ( (int)pCut->nLeaves == p->nLutSize )
                        return NULL;
                    pCut->pLeaves[pCut->nLeaves++] = pTemp->pLeaves[i];
                }
            }
        }
    }
    if ( pCut1 == NULL )
    {
        pCut->hNext    = 0;
        pCut->iFunc    = pCut0->iFunc;
        pCut->fUseless = pCut0->fUseless;
        pCut->fCompl   = pCut0->fCompl;
    }
    else
    {
        pCut->hNext    = 0;
        pCut->iFunc    = 0;  pCut->iFunc = ~pCut->iFunc;
        pCut->fUseless = 0;
        pCut->fCompl   = 0;
    }
    p->nCutsMerged++;
    p->nCutsMergedAll++;
    if ( p->pPars->fUseTruth )
        Vec_IntSelectSort( pCut->pLeaves, pCut->nLeaves );
    return pCut;
}